

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebuggerObject.cpp
# Opt level: O2

void __thiscall JsrtDebugStackFrames::~JsrtDebugStackFrames(JsrtDebugStackFrames *this)

{
  ArenaAllocator *allocator;
  
  if (this->framesDictionary != (FramesDictionary *)0x0) {
    ClearFrameDictionary(this);
    allocator = JsrtDebugManager::GetDebugObjectArena(this->jsrtDebugManager);
    Memory::
    DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,JsUtil::BaseDictionary<unsigned_int,JsrtDebuggerStackFrame*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>>
              (allocator,this->framesDictionary);
    this->framesDictionary = (FramesDictionary *)0x0;
  }
  return;
}

Assistant:

JsrtDebugStackFrames::~JsrtDebugStackFrames()
{
    if (this->framesDictionary != nullptr)
    {
        this->ClearFrameDictionary();
        Adelete(this->jsrtDebugManager->GetDebugObjectArena(), this->framesDictionary);
        this->framesDictionary = nullptr;
    }
}